

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O3

void vkt::addFunctionCaseWithPrograms<vkt::pipeline::(anonymous_namespace)::CaseDef>
               (TestCaseGroup *group,string *name,string *desc,Function_conflict initPrograms,
               Function_conflict testFunc,CaseDef_conflict *arg0)

{
  undefined4 uVar1;
  TestContext *testCtx;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  TestNode *node;
  
  testCtx = (group->super_TestNode).m_testCtx;
  uVar1 = *(undefined4 *)testFunc;
  uVar3 = *(undefined8 *)(testFunc + 4);
  uVar4 = *(undefined8 *)(testFunc + 0xc);
  uVar2 = *(undefined8 *)(testFunc + 0x14);
  node = (TestNode *)operator_new(0xa0);
  tcu::TestCase::TestCase((TestCase *)node,testCtx,NODETYPE_SELF_VALIDATE,(char *)name,(char *)desc)
  ;
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d29960;
  node[1]._vptr_TestNode = (_func_int **)pipeline::anon_unknown_0::initPrograms;
  node[1].m_testCtx = (TestContext *)initPrograms;
  *(undefined4 *)&node[1].m_name._M_dataplus._M_p = uVar1;
  *(undefined8 *)((long)&node[1].m_name._M_dataplus._M_p + 4) = uVar3;
  *(undefined8 *)((long)&node[1].m_name._M_string_length + 4) = uVar4;
  *(undefined8 *)((long)&node[1].m_name.field_2 + 4) = uVar2;
  tcu::TestNode::addChild(&group->super_TestNode,node);
  return;
}

Assistant:

void addFunctionCaseWithPrograms (tcu::TestCaseGroup*							group,
								  const std::string&							name,
								  const std::string&							desc,
								  typename FunctionPrograms1<Arg0>::Function	initPrograms,
								  typename FunctionInstance1<Arg0>::Function	testFunc,
								  Arg0											arg0)
{
	group->addChild(createFunctionCaseWithPrograms<Arg0>(group->getTestContext(), tcu::NODETYPE_SELF_VALIDATE, name, desc, initPrograms, testFunc, arg0));
}